

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O0

Result host_write_joypad_to_file(Host *host,char *filename)

{
  Result RVar1;
  undefined1 local_30 [8];
  FileData file_data;
  Result result;
  char *filename_local;
  Host *host_local;
  
  file_data.size._4_4_ = ERROR;
  joypad_init_file_data(host->joypad_buffer,(FileData *)local_30);
  joypad_write(host->joypad_buffer,(FileData *)local_30);
  RVar1 = file_write(filename,(FileData *)local_30);
  if (RVar1 == OK) {
    file_data.size._4_4_ = OK;
  }
  file_data_delete((FileData *)local_30);
  return file_data.size._4_4_;
}

Assistant:

Result host_write_joypad_to_file(struct Host* host, const char* filename) {
  Result result = ERROR;
  FileData file_data;
  joypad_init_file_data(host->joypad_buffer, &file_data);
  joypad_write(host->joypad_buffer, &file_data);
  CHECK(SUCCESS(file_write(filename, &file_data)));
  result = OK;
error:
  file_data_delete(&file_data);
  return result;
}